

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SendEventAsync
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,IOTHUB_MESSAGE_HANDLE eventMessageHandle,
          IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK eventConfirmationCallback,
          void *userContextCallback)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  undefined8 *__ptr;
  IOTHUB_MESSAGE_HANDLE messageHandle;
  IOTHUB_CLIENT_RESULT IVar3;
  char *pcVar4;
  
  if ((eventMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 ||
       iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
     (userContextCallback != (void *)0x0 &&
      eventConfirmationCallback == (IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    iVar1 = 0x764;
    IVar3 = IOTHUB_CLIENT_INVALID_ARG;
    pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[1];
  }
  else {
    __ptr = (undefined8 *)malloc(0x38);
    if (__ptr == (undefined8 *)0x0) {
      p_Var2 = xlogging_get_log_function();
      IVar3 = IOTHUB_CLIENT_ERROR;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return IOTHUB_CLIENT_ERROR;
      }
      iVar1 = 0x76c;
      pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[2];
    }
    else {
      if (iotHubClientHandle->currentMessageTimeout == 0) {
        __ptr[5] = 0;
        __ptr[6] = 0;
      }
      else {
        iVar1 = tickcounter_get_current_ms(iotHubClientHandle->tickCounter,__ptr + 5);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"attach_ms_timesOutAfter",0x74f,1,
                      "unable to get the current relative tickcount");
          }
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_SendEventAsync",0x775,1,"result = %s",
                      IOTHUB_CLIENT_RESULTStringStorage[2]);
          }
          free(__ptr);
          return IOTHUB_CLIENT_ERROR;
        }
        __ptr[6] = iotHubClientHandle->currentMessageTimeout;
      }
      messageHandle = IoTHubMessage_Clone(eventMessageHandle);
      *__ptr = messageHandle;
      if (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
        free(__ptr);
        p_Var2 = xlogging_get_log_function();
        IVar3 = IOTHUB_CLIENT_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        iVar1 = 0x77e;
        pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[2];
      }
      else {
        iVar1 = IoTHubClient_Diagnostic_AddIfNecessary
                          (&iotHubClientHandle->diagnostic_setting,messageHandle);
        if (iVar1 == 0) {
          __ptr[1] = eventConfirmationCallback;
          __ptr[2] = userContextCallback;
          DList_InsertTailList(&iotHubClientHandle->waitingToSend,(PDLIST_ENTRY)(__ptr + 3));
          return IOTHUB_CLIENT_OK;
        }
        IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)*__ptr);
        free(__ptr);
        p_Var2 = xlogging_get_log_function();
        IVar3 = IOTHUB_CLIENT_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        iVar1 = 0x785;
        pcVar4 = IOTHUB_CLIENT_RESULTStringStorage[2];
      }
    }
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_SendEventAsync",iVar1,1,"result = %s",pcVar4);
  return IVar3;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SendEventAsync(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_MESSAGE_HANDLE eventMessageHandle, IOTHUB_CLIENT_EVENT_CONFIRMATION_CALLBACK eventConfirmationCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (eventMessageHandle == NULL) ||
        ((eventConfirmationCallback == NULL) && (userContextCallback != NULL))
        )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        IOTHUB_MESSAGE_LIST *newEntry = (IOTHUB_MESSAGE_LIST*)malloc(sizeof(IOTHUB_MESSAGE_LIST));
        if (newEntry == NULL)
        {
            result = IOTHUB_CLIENT_ERROR;
            LOG_ERROR_RESULT;
        }
        else
        {
            IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

            if (attach_ms_timesOutAfter(handleData, newEntry) != 0)
            {
                result = IOTHUB_CLIENT_ERROR;
                LOG_ERROR_RESULT;
                free(newEntry);
            }
            else
            {
                if ((newEntry->messageHandle = IoTHubMessage_Clone(eventMessageHandle)) == NULL)
                {
                    result = IOTHUB_CLIENT_ERROR;
                    free(newEntry);
                    LOG_ERROR_RESULT;
                }
                else if (IoTHubClient_Diagnostic_AddIfNecessary(&handleData->diagnostic_setting, newEntry->messageHandle) != 0)
                {
                    result = IOTHUB_CLIENT_ERROR;
                    IoTHubMessage_Destroy(newEntry->messageHandle);
                    free(newEntry);
                    LOG_ERROR_RESULT;
                }
                else
                {
                    newEntry->callback = eventConfirmationCallback;
                    newEntry->context = userContextCallback;
                    DList_InsertTailList(&(iotHubClientHandle->waitingToSend), &(newEntry->entry));
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
    }
    return result;
}